

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TPM2_ReadPublic(TSS_DEVICE *tpm,TPMI_DH_OBJECT objectHandle,TPM2B_PUBLIC *outPublic,
                      TPM2B_NAME *name,TPM2B_NAME *qualifiedName)

{
  BYTE **buffer;
  UINT32 *size;
  TPM_RC TVar1;
  TPM_RC TVar2;
  LOGGER_LOG p_Var3;
  TPMI_DH_OBJECT objectHandle_local;
  TSS_CMD_CONTEXT CmdCtx;
  
  objectHandle_local = objectHandle;
  if ((name == (TPM2B_NAME *)0x0 || outPublic == (TPM2B_PUBLIC *)0x0) ||
      qualifiedName == (TPM2B_NAME *)0x0) {
    p_Var3 = xlogging_get_log_function();
    TVar1 = 0x101;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TPM2_ReadPublic",0x41b,1,
                "Invalid parameter outPublic: %p, name: %p, qualifiedName: %p",outPublic,name,
                qualifiedName);
    }
  }
  else {
    CmdCtx.ParamSize = 0;
    TVar1 = TSS_DispatchCmd(tpm,0x173,&objectHandle_local,1,(TSS_SESSION **)0x0,0,&CmdCtx);
    if (TVar1 == 0) {
      buffer = &CmdCtx.RespBufPtr;
      size = &CmdCtx.RespBytesLeft;
      TVar2 = TPM2B_PUBLIC_Unmarshal(outPublic,buffer,(INT32 *)size,1);
      TVar1 = 0x9a;
      if (TVar2 == 0) {
        TVar2 = TPM2B_NAME_Unmarshal(name,buffer,(INT32 *)size);
        if (TVar2 == 0) {
          TVar2 = TPM2B_NAME_Unmarshal(qualifiedName,buffer,(INT32 *)size);
          TVar1 = 0x9a;
          if (TVar2 == 0) {
            TVar1 = 0;
          }
        }
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPM2_ReadPublic(
    TSS_DEVICE         *tpm,                    // IN/OUT
    TPMI_DH_OBJECT      objectHandle,           // IN
    TPM2B_PUBLIC       *outPublic,              // OUT
    TPM2B_NAME         *name,                   // OUT
    TPM2B_NAME         *qualifiedName           // OUT
)
{
    if (outPublic == NULL || name == NULL || qualifiedName == NULL)
    {
        LogError("Invalid parameter outPublic: %p, name: %p, qualifiedName: %p", outPublic, name, qualifiedName);
        return TPM_RC_FAILURE;
    }
    else
    {
        TSS_CMD_CONTEXT  CmdCtx;

        BEGIN_CMD();
        DISPATCH_CMD(ReadPublic, &objectHandle, 1, NULL, 0);
        TSS_UNMARSHAL_FLAGGED(TPM2B_PUBLIC, outPublic);
        TSS_UNMARSHAL(TPM2B_NAME, name);
        TSS_UNMARSHAL(TPM2B_NAME, qualifiedName);
        END_CMD();
    }
}